

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CatalogReader.hpp
# Opt level: O1

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
* __thiscall
CatalogReader::createCourseHeirarchy_abi_cxx11_
          (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
           *__return_storage_ptr__,CatalogReader *this)

{
  pointer pcVar1;
  iterator iVar2;
  pointer pbVar3;
  ostream *poVar4;
  iterator iVar5;
  long *plVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  pointer pbVar9;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
  *heirarchy;
  CourseComponent *temp;
  CourseComponent *course;
  vector<CourseComponent_*,_std::allocator<CourseComponent_*>_> *cList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> required;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prereqs;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
  courses;
  ifstream fin;
  CourseComponent *local_410;
  CourseComponent *local_408;
  vector<CourseComponent*,std::allocator<CourseComponent*>> *local_400;
  char *local_3f8;
  long local_3f0;
  char local_3e8 [24];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_3d0;
  key_type local_398;
  code *local_378;
  pointer local_370;
  pointer local_368;
  string local_300 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  undefined1 local_270 [32];
  float local_250;
  size_t local_248;
  __node_base_ptr p_Stack_240;
  ifstream local_238 [520];
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270,
                 &this->resourcesPath,&this->resourceExtension);
  std::ifstream::ifstream(local_238,(string *)local_270,_S_in);
  if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
    operator_delete((void *)local_270._0_8_);
  }
  local_270._0_8_ = &p_Stack_240;
  local_270._8_8_ = 1;
  local_270._16_8_ = 0;
  local_270._24_8_ = 0;
  local_250 = 1.0;
  local_248 = 0;
  p_Stack_240 = (__node_base_ptr)0x0;
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  if (this->debugOn == true) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->beginDebugString)._M_dataplus._M_p,
                        (this->beginDebugString)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Reader resourcepath: ",0x15);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->resourcesPath)._M_dataplus._M_p,
                        (this->resourcesPath)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  getCoursesFromFile_abi_cxx11_
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
              *)&local_3d0,this,local_238);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_270,&local_3d0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_3d0);
  (*this->major->_vptr_AbstractMajor[1])(&local_288);
  local_370 = local_288.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_378 = std::ostream::flush;
    do {
      local_3d0._M_buckets = &local_3d0._M_before_begin._M_nxt;
      pcVar1 = ((local_288.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      local_368 = local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3d0,pcVar1,
                 pcVar1 + (local_288.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      local_400 = (vector<CourseComponent*,std::allocator<CourseComponent*>> *)operator_new(0x18);
      *(undefined8 *)local_400 = 0;
      *(undefined8 *)(local_400 + 8) = 0;
      *(undefined8 *)(local_400 + 0x10) = 0;
      if (this->debugOn == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Attempting to add ",0x12);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_3d0._M_buckets,
                            local_3d0._M_bucket_count);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," to heirarchy",0xd);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      iVar5 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)local_270,(key_type *)&local_3d0);
      if (iVar5.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_true>
          ._M_cur == (__node_type *)0x0) {
        uVar7 = std::__throw_out_of_range("_Map_base::at");
LAB_0010749f:
        if ((__node_base *)local_3d0._M_buckets != &local_3d0._M_before_begin) {
          operator_delete(local_3d0._M_buckets);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_288);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&__return_storage_ptr__->_M_h);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_270);
        std::ifstream::~ifstream(local_238);
        _Unwind_Resume(uVar7);
      }
      local_408 = *(CourseComponent **)
                   ((long)iVar5.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_true>
                          ._M_cur + 0x28);
      iVar2._M_current = *(CourseComponent ***)(local_400 + 8);
      if (iVar2._M_current == *(CourseComponent ***)(local_400 + 0x10)) {
        std::vector<CourseComponent*,std::allocator<CourseComponent*>>::
        _M_realloc_insert<CourseComponent*const&>(local_400,iVar2,&local_408);
      }
      else {
        *iVar2._M_current = local_408;
        *(long *)(local_400 + 8) = *(long *)(local_400 + 8) + 8;
      }
      if (local_408 == (CourseComponent *)0x0) {
        plVar6 = (long *)0x0;
      }
      else {
        plVar6 = (long *)__dynamic_cast(local_408,&CourseComponent::typeinfo,&Course::typeinfo,0);
      }
      if (plVar6 == (long *)0x0) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = local_378;
        __cxa_throw(puVar8,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      local_300[0]._M_dataplus._M_p = (pointer)&local_300[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_300,plVar6[0xd],plVar6[0xe] + plVar6[0xd]);
      getPrereqs(&local_2a0,this,local_300);
      pbVar9 = local_2a0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = local_2a0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300[0]._M_dataplus._M_p != &local_300[0].field_2) {
        operator_delete(local_300[0]._M_dataplus._M_p);
        pbVar9 = local_2a0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = local_2a0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; pbVar9 != pbVar3; pbVar9 = pbVar9 + 1) {
        pcVar1 = (pbVar9->_M_dataplus)._M_p;
        local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_398,pcVar1,pcVar1 + pbVar9->_M_string_length);
        if (this->debugOn == true) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Adding ",7);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_398._M_dataplus._M_p,
                              local_398._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," to prereqs of ",0xf);
          (**(code **)(*plVar6 + 0x18))(&local_3f8,plVar6);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_3f8,local_3f0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          if (local_3f8 != local_3e8) {
            operator_delete(local_3f8);
          }
        }
        iVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)local_270,&local_398);
        if (iVar5.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_true>
            ._M_cur == (__node_type *)0x0) {
          uVar7 = std::__throw_out_of_range("_Map_base::at");
          goto LAB_0010749f;
        }
        local_410 = *(CourseComponent **)
                     ((long)iVar5.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_true>
                            ._M_cur + 0x28);
        iVar2._M_current = *(CourseComponent ***)(local_400 + 8);
        if (iVar2._M_current == *(CourseComponent ***)(local_400 + 0x10)) {
          std::vector<CourseComponent*,std::allocator<CourseComponent*>>::
          _M_realloc_insert<CourseComponent*const&>(local_400,iVar2,&local_410);
        }
        else {
          *iVar2._M_current = local_410;
          *(long *)(local_400 + 8) = *(long *)(local_400 + 8) + 8;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2a0);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<CourseComponent*,std::allocator<CourseComponent*>>*>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<CourseComponent*,std::allocator<CourseComponent*>>*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_emplace<std::__cxx11::string&,std::vector<CourseComponent*,std::allocator<CourseComponent*>>*&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<CourseComponent*,std::allocator<CourseComponent*>>*>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<CourseComponent*,std::allocator<CourseComponent*>>*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)__return_storage_ptr__,&local_3d0,&local_400);
      if ((__node_base *)local_3d0._M_buckets != &local_3d0._M_before_begin) {
        operator_delete(local_3d0._M_buckets);
      }
      local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_368 + 1;
    } while (local_288.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != local_370);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288);
  if (this->debugOn != false) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->endDebugString)._M_dataplus._M_p,
                        (this->endDebugString)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_270);
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

unordered_map<string, vector<CourseComponent*>*> createCourseHeirarchy() const {
			ifstream fin(resourcesPath + resourceExtension);
			unordered_map<string, CourseComponent*> courses;
			unordered_map<string, vector<CourseComponent*>*> heirarchy;
			
			if (debugOn) {
				cout << beginDebugString << endl;
				cout << "Reader resourcepath: " << resourcesPath << endl;
			}
			
			courses = getCoursesFromFile(fin);

			for (auto required : major->getRequiredCourses()) {
				vector<CourseComponent*>* cList = new vector<CourseComponent*>();
				if (debugOn) {
					cout << "Attempting to add " << required << " to heirarchy" << endl;
				}
				CourseComponent* course;
				try { // if course cannot be found initially, just make it a prereq
					course = courses.at(required);
				} catch (out_of_range& e) {
					course = new Prerequisite(required, 4, "");
				}
				// push it to the list

				cList->push_back(course);
				try {
					// attempt to cast it to course to see if it has prerequisites;
					Course* courseCast = dynamic_cast<Course*>(course);
					if (courseCast == nullptr) {
						throw bad_cast(); // throw bad cast to get caught so that it can be a prereq type
					}

					// if it passed, get the prereqs in a vector
					vector<string> prereqs = getPrereqs(courseCast->getCourseRequisites());
					// loop through them and see if we can find them in the courses;
					for (auto name : prereqs) {
						if (debugOn) {
							cout << "Adding " << name << " to prereqs of " << courseCast->getCourseName() << endl;
						}
						CourseComponent* temp;
						try {
							temp = courses.at(name); // check if it exists;
						}
						catch (out_of_range& e) {
							// if it doesnt exist, just say we're unable to retrieve and construct a new one;
							temp = new Course(name, 4, "Unable to Retreive", "Unable to Retreive");
							if (debugOn) {
								cout << temp->getCourseName() << " is being added as a constructed prereq" << endl;
							}
						}
						// push it to the cList;
						cList->push_back(temp);
					}
				} catch (bad_cast& e) {
					if (debugOn) {
						cout << "NOT A COURSE, SIMPLY ADDING AS PREREQUISITE" << endl;
					}
				}
				heirarchy.emplace(required, cList);
			}

			if (debugOn) {
				cout << endDebugString << endl;
			}

			return heirarchy;
		}